

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O3

bool __thiscall cmSetPropertyCommand::HandleDirectoryMode(cmSetPropertyCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong uVar3;
  _Base_ptr p_Var4;
  long lVar5;
  bool bVar6;
  cmGlobalGenerator *this_00;
  cmMakefile *this_01;
  char *value;
  char *value_00;
  string dir;
  string local_60;
  string local_40;
  
  uVar3 = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (uVar3 < 2) {
    if (uVar3 == 0) {
      this_01 = (this->super_cmCommand).Makefile;
    }
    else {
      p_Var4 = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      paVar1 = &local_60.field_2;
      lVar5 = *(long *)(p_Var4 + 1);
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,lVar5,(long)&(p_Var4[1]._M_parent)->_M_color + lVar5);
      bVar6 = cmsys::SystemTools::FileIsFullPath(&local_60);
      if (!bVar6) {
        cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
        std::__cxx11::string::_M_assign((string *)&local_60);
        std::__cxx11::string::append((char *)&local_60);
        std::__cxx11::string::_M_append
                  ((char *)&local_60,
                   *(ulong *)((this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1
                             ));
      }
      cmsys::SystemTools::CollapseFullPath(&local_40,&local_60);
      std::__cxx11::string::operator=((string *)&local_60,(string *)&local_40);
      paVar2 = &local_40.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != paVar2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
      this_01 = cmGlobalGenerator::FindMakefile(this_00,&local_60);
      if (this_01 == (cmMakefile *)0x0) {
        local_40._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,
                   "DIRECTORY scope provided but requested directory was not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                   ,"");
        cmCommand::SetError(&this->super_cmCommand,&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != paVar2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) goto LAB_0023d62e;
        goto LAB_0023d63b;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    if (this->Remove == false) {
      value_00 = (this->PropertyValue)._M_dataplus._M_p;
    }
    else {
      value_00 = (char *)0x0;
    }
    if (this->AppendMode == true) {
      value = "";
      if (value_00 != (char *)0x0) {
        value = value_00;
      }
      cmMakefile::AppendProperty(this_01,&this->PropertyName,value,this->AppendAsString);
    }
    else {
      cmMakefile::SetProperty(this_01,&this->PropertyName,value_00);
    }
    bVar6 = true;
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"allows at most one name for DIRECTORY scope.","");
    cmCommand::SetError(&this->super_cmCommand,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
LAB_0023d62e:
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
LAB_0023d63b:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool cmSetPropertyCommand::HandleDirectoryMode()
{
  if (this->Names.size() > 1) {
    this->SetError("allows at most one name for DIRECTORY scope.");
    return false;
  }

  // Default to the current directory.
  cmMakefile* mf = this->Makefile;

  // Lookup the directory if given.
  if (!this->Names.empty()) {
    // Construct the directory name.  Interpret relative paths with
    // respect to the current directory.
    std::string dir = *this->Names.begin();
    if (!cmSystemTools::FileIsFullPath(dir)) {
      dir = this->Makefile->GetCurrentSourceDirectory();
      dir += "/";
      dir += *this->Names.begin();
    }

    // The local generators are associated with collapsed paths.
    dir = cmSystemTools::CollapseFullPath(dir);

    mf = this->Makefile->GetGlobalGenerator()->FindMakefile(dir);
    if (!mf) {
      // Could not find the directory.
      this->SetError(
        "DIRECTORY scope provided but requested directory was not found. "
        "This could be because the directory argument was invalid or, "
        "it is valid but has not been processed yet.");
      return false;
    }
  }

  // Set or append the property.
  std::string const& name = this->PropertyName;
  const char* value = this->PropertyValue.c_str();
  if (this->Remove) {
    value = nullptr;
  }
  if (this->AppendMode) {
    mf->AppendProperty(name, value ? value : "", this->AppendAsString);
  } else {
    mf->SetProperty(name, value);
  }

  return true;
}